

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_hmac.c
# Opt level: O2

void beltHMACStart(void *state,octet *key,size_t len)

{
  u32 *dest;
  u32 *X;
  void *stack;
  byte *pbVar1;
  long lVar2;
  octet *poVar3;
  size_t sVar4;
  ulong count;
  
  if (len < 0x21) {
    memCopy((void *)((long)state + 0xd0),key,len);
    memSet((void *)((long)state + len + 0xd0),'\0',0x20 - len);
  }
  else {
    *(undefined8 *)state = 0;
    *(undefined8 *)((long)state + 8) = 0;
    beltBlockAddBitSizeU32((u32 *)state,len);
    dest = (u32 *)((long)state + 0x20);
    *(undefined8 *)((long)state + 0x10) = 0;
    *(undefined8 *)((long)state + 0x18) = 0;
    poVar3 = beltH();
    u32From(dest,poVar3,0x20);
    X = (u32 *)((long)state + 0xd0);
    stack = (void *)((long)state + 0xf8);
    for (sVar4 = len; 0x1f < sVar4; sVar4 = sVar4 - 0x20) {
      *(undefined8 *)((long)state + 0xd0) = *(undefined8 *)key;
      *(undefined8 *)((long)state + 0xd8) = *(undefined8 *)(key + 8);
      *(undefined8 *)((long)state + 0xe0) = *(undefined8 *)(key + 0x10);
      *(undefined8 *)((long)state + 0xe8) = *(undefined8 *)(key + 0x18);
      beltCompr2((u32 *)((long)state + 0x10),dest,X,stack);
      key = key + 0x20;
    }
    count = len & 0x1f;
    if (count != 0) {
      memCopy(X,key,count);
      memSet((void *)((long)X + count),'\0',0x20 - count);
      beltCompr2((u32 *)((long)state + 0x10),dest,X,stack);
    }
    beltCompr(dest,(u32 *)state,stack);
    *(undefined8 *)((long)state + 0xd0) = *(undefined8 *)((long)state + 0x20);
    *(undefined8 *)((long)state + 0xd8) = *(undefined8 *)((long)state + 0x28);
    *(undefined8 *)((long)state + 0xe0) = *(undefined8 *)((long)state + 0x30);
    *(undefined8 *)((long)state + 0xe8) = *(undefined8 *)((long)state + 0x38);
  }
  for (lVar2 = 0xd0; lVar2 != 0xf0; lVar2 = lVar2 + 1) {
    *(byte *)((long)state + lVar2) = *(byte *)((long)state + lVar2) ^ 0x36;
  }
  *(undefined8 *)state = 0;
  *(undefined8 *)((long)state + 8) = 0;
  beltBlockAddBitSizeU32((u32 *)state,0x20);
  *(undefined8 *)((long)state + 0x10) = 0;
  *(undefined8 *)((long)state + 0x18) = 0;
  poVar3 = beltH();
  u32From((u32 *)((long)state + 0x20),poVar3,0x20);
  beltCompr2((u32 *)((long)state + 0x10),(u32 *)((long)state + 0x20),(u32 *)((long)state + 0xd0),
             (void *)((long)state + 0xf8));
  *(undefined8 *)((long)state + 0xf0) = 0;
  for (lVar2 = 0; lVar2 != -0x20; lVar2 = lVar2 + -1) {
    pbVar1 = (byte *)((long)state + lVar2 + 0xef);
    *pbVar1 = *pbVar1 ^ 0x6a;
  }
  *(undefined8 *)((long)state + 0x60) = 0;
  *(undefined8 *)((long)state + 0x68) = 0;
  beltBlockAddBitSizeU32((u32 *)((long)state + 0x60),0x40);
  *(undefined8 *)((long)state + 0x70) = 0;
  *(undefined8 *)((long)state + 0x78) = 0;
  poVar3 = beltH();
  u32From((u32 *)((long)state + 0x80),poVar3,0x20);
  beltCompr2((u32 *)((long)state + 0x70),(u32 *)((long)state + 0x80),(u32 *)((long)state + 0xd0),
             (void *)((long)state + 0xf8));
  return;
}

Assistant:

void beltHMACStart(void* state, const octet key[], size_t len)
{
	belt_hmac_st* st = (belt_hmac_st*)state;
	ASSERT(memIsDisjoint2(key, len, state, beltHMAC_keep()));
	// key <- key || 0
	if (len <= 32)
	{
		memCopy(st->block, key, len);
		memSetZero(st->block + len, 32 - len);
#if (OCTET_ORDER == BIG_ENDIAN)
		beltBlockRevU32(st->block);
		beltBlockRevU32(st->block + 16);
#endif
	}
	// key <- beltHash(key)
	else
	{
		beltBlockSetZero(st->ls_in);
		beltBlockAddBitSizeU32(st->ls_in, len);
		beltBlockSetZero(st->ls_in + 4);
		u32From(st->h_in, beltH(), 32);
		while (len >= 32)
		{
			beltBlockCopy(st->block, key);
			beltBlockCopy(st->block + 16, key + 16);
#if (OCTET_ORDER == BIG_ENDIAN)
			beltBlockRevU32(st->block);
			beltBlockRevU32(st->block + 16);
#endif
			beltCompr2(st->ls_in + 4, st->h_in, (u32*)st->block, st->stack);
			key += 32;
			len -= 32;
		}
		if (len)
		{
			memCopy(st->block, key, len);
			memSetZero(st->block + len, 32 - len);
#if (OCTET_ORDER == BIG_ENDIAN)
			beltBlockRevU32(st->block);
			beltBlockRevU32(st->block + 16);
#endif
			beltCompr2(st->ls_in + 4, st->h_in, (u32*)st->block, st->stack);
		}
		beltCompr(st->h_in, st->ls_in, st->stack);
		beltBlockCopy(st->block, st->h_in);
		beltBlockCopy(st->block + 16, st->h_in + 4);
	}
	// сформировать key ^ ipad
	for (len = 0; len < 32; ++len)
		st->block[len] ^= 0x36;
	// начать внутреннее хэширование
	beltBlockSetZero(st->ls_in);
	beltBlockAddBitSizeU32(st->ls_in, 32);
	beltBlockSetZero(st->ls_in + 4);
	u32From(st->h_in, beltH(), 32);
	beltCompr2(st->ls_in + 4, st->h_in, (u32*)st->block, st->stack);
	st->filled = 0;
	// сформировать key ^ opad [0x36 ^ 0x5C == 0x6A]
	for (; len--; )
		st->block[len] ^= 0x6A;
	// начать внешнее хэширование [будет хэшироваться ровно два блока]
	beltBlockSetZero(st->ls_out);
	beltBlockAddBitSizeU32(st->ls_out, 32 * 2);
	beltBlockSetZero(st->ls_out + 4);
	u32From(st->h_out, beltH(), 32);
	beltCompr2(st->ls_out + 4, st->h_out, (u32*)st->block, st->stack);
}